

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_run_compression_cpp(bool copy_on_write)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  uint32_t i;
  uint32_t val;
  Roaring r1;
  roaring_array_t local_48;
  
  local_48.keys = (uint16_t *)0x0;
  local_48.typecodes = (uint8_t *)0x0;
  local_48.size = 0;
  local_48.allocation_size = 0;
  local_48.containers = (container_s **)0x0;
  local_48.flags = '\0';
  local_48._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_48,0);
  local_48.flags = local_48.flags & 0xfe | copy_on_write;
  val = 100;
  do {
    roaring_bitmap_add((roaring_bitmap_t *)&local_48,val);
    val = val + 1;
  } while (val != 0x2711);
  sVar2 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_48);
  _Var1 = roaring_bitmap_run_optimize((roaring_bitmap_t *)&local_48);
  sVar3 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_48);
  _assert_true((ulong)_Var1,"has_run",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,499);
  _assert_true((ulong)(sVar3 < sVar2),"size_origin > size_optimized",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,500);
  _Var1 = roaring_bitmap_remove_run_compression((roaring_bitmap_t *)&local_48);
  _assert_true((ulong)_Var1,"removed",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1f6);
  sVar2 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)&local_48);
  _assert_true((ulong)(sVar3 < sVar2),"size_removed > size_optimized",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x1f8);
  roaring::Roaring::~Roaring((Roaring *)&local_48);
  return;
}

Assistant:

void test_run_compression_cpp(bool copy_on_write) {
    Roaring r1;
    r1.setCopyOnWrite(copy_on_write);
    for (uint32_t i = 100; i <= 10000; i++) {
        r1.add(i);
    }
    uint64_t size_origin = r1.getSizeInBytes();
    bool has_run = r1.runOptimize();
    uint64_t size_optimized = r1.getSizeInBytes();
    assert_true(has_run);
    assert_true(size_origin > size_optimized);
    bool removed = r1.removeRunCompression();
    assert_true(removed);
    uint64_t size_removed = r1.getSizeInBytes();
    assert_true(size_removed > size_optimized);
    return;
}